

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::Parser::Parser(Parser *this)

{
  Parser *this_local;
  
  SymbolTable<flatbuffers::StructDef>::SymbolTable(&this->structs_);
  SymbolTable<flatbuffers::EnumDef>::SymbolTable(&this->enums_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->name_space_);
  std::__cxx11::string::string((string *)&this->error_);
  FlatBufferBuilder::FlatBufferBuilder(&this->builder_,0x400);
  this->root_struct_def = (StructDef *)0x0;
  this->source_ = (char *)0x0;
  this->cursor_ = (char *)0x0;
  this->line_ = 1;
  std::__cxx11::string::string((string *)&this->attribute_);
  std::__cxx11::string::string((string *)&this->doc_comment_);
  std::
  vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
  ::vector(&this->field_stack_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->struct_stack_);
  return;
}

Assistant:

Parser() :
    root_struct_def(nullptr),
    source_(nullptr),
    cursor_(nullptr),
    line_(1) {}